

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

bool ImGui::BeginTableEx(char *name,ImGuiID id,int columns_count,ImGuiTableFlags flags,
                        ImVec2 *outer_size,float inner_width)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  double dVar3;
  short sVar4;
  uint uVar5;
  ImGuiWindow *pIVar6;
  ImGuiTableTempData *pIVar7;
  ImGuiWindow *pIVar8;
  float *__src;
  void *pvVar9;
  ImGuiTableColumn *pIVar10;
  ImGuiContext_conflict1 *pIVar11;
  void *pvVar12;
  _Bool _Var13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ImU32 IVar17;
  ImGuiTableColumn *p;
  ImGuiTable *p_00;
  ImGuiTableTempData *pIVar18;
  ImDrawListSplitter *pIVar19;
  float *__dest;
  void *ptr;
  ImGuiTableColumn *pIVar20;
  char *__dest_00;
  uint uVar21;
  long lVar22;
  ImRect *pIVar23;
  char *pcVar24;
  ulong uVar25;
  long lVar26;
  ImGuiTableColumn *pIVar27;
  int iVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  ImVec2 *pIVar32;
  ImGuiTableColumnFlags *pIVar33;
  ImVec2 *pIVar34;
  int iVar35;
  long lVar36;
  byte bVar37;
  ImVec2 IVar38;
  undefined8 extraout_XMM0_Qb;
  ImVec2 IVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  ImGuiContext *g;
  ImRect outer_rect;
  ImGuiID local_11c;
  ImS16 local_100;
  ImRect local_e0;
  ImGuiTableTempData *local_d0;
  char *local_c8;
  ulong local_c0;
  ImVec2 *local_b8;
  ImGuiWindow *local_b0;
  ImVec2 local_a8;
  undefined8 uStack_a0;
  ImDrawListSplitter local_98;
  undefined3 uStack_80;
  undefined5 uStack_7d;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined3 uStack_70;
  undefined5 uStack_6d;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar11 = GImGui;
  bVar37 = 0;
  pIVar6 = (ImGuiWindow *)GImGui->CurrentWindow;
  pIVar6->WriteAccessed = true;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  uVar25 = (ulong)(uint)columns_count;
  if (0x3f < columns_count - 1U) {
    __assert_fail("columns_count > 0 && columns_count <= 64 && \"Only 1..64 columns allowed!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x13e,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  if ((((uint)flags >> 0x18 & 1) != 0) && (inner_width < 0.0)) {
    __assert_fail("inner_width >= 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x140,
                  "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                 );
  }
  IVar38 = GetContentRegionAvail();
  fVar42 = IVar38.y;
  auVar41._8_4_ = (int)extraout_XMM0_Qb;
  auVar41._0_4_ = IVar38.x;
  auVar41._4_4_ = IVar38.y;
  auVar41._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
  if (IVar38.x <= 1.0) {
    auVar41._0_4_ = 0x3f800000;
  }
  if ((flags & 0x3000000U) == 0) {
    IVar38 = CalcItemSize(*outer_size,auVar41._0_4_,0.0);
    local_e0.Min = (pIVar6->DC).CursorPos;
    local_e0.Max.x = IVar38.x + local_e0.Min.x;
    local_e0.Max.y = IVar38.y + local_e0.Min.y;
  }
  else {
    if (fVar42 <= 1.0) {
      fVar42 = 1.0;
    }
    IVar38 = CalcItemSize(*outer_size,auVar41._0_4_,fVar42);
    local_e0.Min = (pIVar6->DC).CursorPos;
    local_e0.Max.x = IVar38.x + local_e0.Min.x;
    local_e0.Max.y = IVar38.y + local_e0.Min.y;
    _Var13 = IsClippedEx(&local_e0,0);
    if (_Var13) {
      ItemSize(&local_e0,-1.0);
      return false;
    }
  }
  local_b8 = outer_size;
  local_b0 = pIVar6;
  p_00 = ImPool<ImGuiTable>::GetOrAddByKey(&pIVar11->Tables,id);
  local_c8 = name;
  local_c0 = (ulong)id;
  if (p_00->LastFrameActive == pIVar11->FrameCount) {
    sVar4 = p_00->InstanceCurrent;
    local_100 = sVar4 + 1;
    local_11c = (int)sVar4 + id + 1;
    uVar5 = p_00->Flags;
    if ((-1 < sVar4) && (p_00->ColumnsCount != columns_count)) {
      __assert_fail("table->ColumnsCount == columns_count && \"BeginTable(): Cannot change columns count mid-frame while preserving same ID\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0x153,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  else {
    uVar5 = p_00->Flags;
    local_100 = 0;
    local_11c = id;
  }
  uVar14 = ImPool<ImGuiTable>::GetIndex(&pIVar11->Tables,p_00);
  pIVar6 = local_b0;
  iVar35 = pIVar11->CurrentTableStackIdx;
  uVar21 = iVar35 + 1;
  pIVar11->CurrentTableStackIdx = uVar21;
  iVar31 = iVar35 + 2;
  iVar29 = (pIVar11->TablesTempDataStack).Size;
  if (iVar29 < iVar31) {
    uStack_a0 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6d = 0;
    local_98._Channels.Data = (ImDrawChannel *)0x0;
    uStack_80 = 0;
    uStack_7d = 0;
    local_98._Current = 0;
    local_98._Count = 0;
    local_98._Channels.Size = 0;
    local_98._Channels.Capacity = 0;
    local_a8.x = 0.0;
    local_a8.y = -1.0;
    iVar28 = (pIVar11->TablesTempDataStack).Capacity;
    if (iVar28 < iVar31) {
      if (iVar28 == 0) {
        iVar28 = 8;
      }
      else {
        iVar28 = iVar28 / 2 + iVar28;
      }
      if (iVar28 <= iVar31) {
        iVar28 = iVar31;
      }
      pIVar18 = (ImGuiTableTempData *)MemAlloc((long)iVar28 * 0x70);
      pIVar7 = (pIVar11->TablesTempDataStack).Data;
      if (pIVar7 != (ImGuiTableTempData *)0x0) {
        local_d0 = pIVar18;
        memcpy(pIVar18,pIVar7,(long)(pIVar11->TablesTempDataStack).Size * 0x70);
        MemFree((pIVar11->TablesTempDataStack).Data);
        pIVar18 = local_d0;
      }
      (pIVar11->TablesTempDataStack).Data = pIVar18;
      (pIVar11->TablesTempDataStack).Capacity = iVar28;
      iVar29 = (pIVar11->TablesTempDataStack).Size;
    }
    if (iVar29 < iVar31) {
      lVar36 = ((long)iVar35 - (long)iVar29) + 2;
      lVar26 = (long)iVar29 * 0x70;
      do {
        pIVar32 = &local_a8;
        pIVar34 = (ImVec2 *)((long)&((pIVar11->TablesTempDataStack).Data)->TableIndex + lVar26);
        for (lVar22 = 0xe; lVar22 != 0; lVar22 = lVar22 + -1) {
          *pIVar34 = *pIVar32;
          pIVar32 = pIVar32 + (ulong)bVar37 * -2 + 1;
          pIVar34 = pIVar34 + (ulong)bVar37 * -2 + 1;
        }
        lVar26 = lVar26 + 0x70;
        lVar36 = lVar36 + -1;
      } while (lVar36 != 0);
    }
    (pIVar11->TablesTempDataStack).Size = iVar31;
    ImDrawListSplitter::ClearFreeMemory(&local_98);
    if (local_98._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_98._Channels.Data);
    }
    uVar21 = pIVar11->CurrentTableStackIdx;
    iVar29 = (pIVar11->TablesTempDataStack).Size;
  }
  if (((int)uVar21 < 0) || (iVar29 <= (int)uVar21)) {
    pcVar24 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
    goto LAB_00212235;
  }
  pIVar18 = (pIVar11->TablesTempDataStack).Data;
  pIVar7 = pIVar18 + uVar21;
  p_00->TempData = pIVar7;
  pIVar18 = pIVar18 + uVar21;
  pIVar19 = &pIVar18->DrawSplitter;
  pIVar18->TableIndex = uVar14;
  p_00->DrawSplitter = pIVar19;
  pIVar19->_Current = 0;
  pIVar19->_Count = 1;
  uVar15 = flags & 0xe000;
  p_00->IsDefaultSizingPolicy = uVar15 == 0;
  uVar21 = flags;
  if (uVar15 == 0) {
    uVar15 = 0x2000;
    if ((((uint)flags >> 0x18 & 1) == 0) && (uVar15 = 0x2000, (pIVar6->Flags & 0x40) == 0)) {
      uVar15 = 0x8000;
    }
    uVar21 = uVar15 | flags;
  }
  uVar16 = uVar21 | 0x40000;
  if (uVar15 != 0x4000) {
    uVar16 = uVar21;
  }
  uVar21 = uVar16 & 0xfffcffff;
  if ((uVar16 & 0x3000000) == 0) {
    uVar21 = uVar16;
  }
  uVar15 = uVar21 & 0xfffff7ff;
  if ((uVar21 >> 0xc & 1) == 0) {
    uVar15 = uVar21;
  }
  uVar21 = (uVar16 & 1) << 9 | uVar15;
  uVar16 = uVar21 | 0x10;
  if ((uVar15 & 0xf) == 0) {
    uVar21 = uVar16;
  }
  if (((uint)pIVar6->RootWindow->Flags >> 8 & 1) != 0) {
    uVar21 = uVar16;
  }
  p_00->ID = (ImGuiID)local_c0;
  p_00->Flags = uVar21;
  p_00->InstanceCurrent = local_100;
  p_00->LastFrameActive = pIVar11->FrameCount;
  p_00->InnerWindow = pIVar6;
  p_00->OuterWindow = pIVar6;
  p_00->ColumnsCount = columns_count;
  p_00->IsLayoutLocked = false;
  p_00->InnerWidth = inner_width;
  pIVar7->UserOuterSize = *local_b8;
  if ((flags & 0x3000000U) == 0) {
    (p_00->InnerRect).Min = local_e0.Min;
    (p_00->InnerRect).Max = local_e0.Max;
    (p_00->OuterRect).Min = local_e0.Min;
    (p_00->OuterRect).Max = local_e0.Max;
    (p_00->WorkRect).Min = local_e0.Min;
    (p_00->WorkRect).Max = local_e0.Max;
  }
  else {
    fVar42 = inner_width;
    if ((uVar21 & 0x1000000) == 0) {
      fVar42 = 3.4028235e+38;
    }
    fVar42 = (float)(~-(uint)(0.0 < inner_width) & 0x7f7fffff |
                    (uint)fVar42 & -(uint)(0.0 < inner_width));
    if (fVar42 != 3.4028235e+38 || (uVar21 & 0x3000000) == 0x1000000) {
      if ((uVar21 & 0x3000000) == 0x1000000) {
        local_a8.y = 1.1754944e-38;
      }
      else {
        local_a8.y = 0.0;
      }
      local_a8.x = (float)(-(uint)(fVar42 != 3.4028235e+38) & (uint)fVar42);
      SetNextWindowContentSize(&local_a8);
    }
    if ((uVar5 & 0x3000000) == 0) {
      local_a8.x = 0.0;
      local_a8.y = 0.0;
      SetNextWindowScroll(&local_a8);
    }
    local_a8.x = local_e0.Max.x - local_e0.Min.x;
    local_a8.y = local_e0.Max.y - local_e0.Min.y;
    BeginChildEx(local_c8,local_11c,&local_a8,false,(uVar21 & 0x1000000) >> 0xd);
    pIVar8 = (ImGuiWindow *)pIVar11->CurrentWindow;
    p_00->InnerWindow = pIVar8;
    IVar38 = (pIVar8->WorkRect).Max;
    (p_00->WorkRect).Min = (pIVar8->WorkRect).Min;
    (p_00->WorkRect).Max = IVar38;
    IVar38 = pIVar8->Pos;
    IVar39.x = (pIVar8->Size).x + IVar38.x;
    IVar39.y = (pIVar8->Size).y + IVar38.y;
    (p_00->OuterRect).Min = IVar38;
    (p_00->OuterRect).Max = IVar39;
    IVar38 = (pIVar8->InnerRect).Max;
    (p_00->InnerRect).Min = (pIVar8->InnerRect).Min;
    (p_00->InnerRect).Max = IVar38;
    if (((((pIVar8->WindowPadding).x != 0.0) || (fVar42 = (pIVar8->WindowPadding).y, fVar42 != 0.0))
        || (NAN(fVar42))) || ((pIVar8->WindowBorderSize != 0.0 || (NAN(pIVar8->WindowBorderSize)))))
    {
      __assert_fail("table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                    ,0x18c,
                    "bool ImGui::BeginTableEx(const char *, ImGuiID, int, ImGuiTableFlags, const ImVec2 &, float)"
                   );
    }
  }
  PushOverrideID(local_11c);
  pIVar8 = p_00->InnerWindow;
  p_00->HostIndentX = (pIVar8->DC).Indent.x;
  IVar38 = (pIVar8->ClipRect).Max;
  (p_00->HostClipRect).Min = (pIVar8->ClipRect).Min;
  (p_00->HostClipRect).Max = IVar38;
  p_00->HostSkipItems = pIVar8->SkipItems;
  IVar38 = (pIVar8->WorkRect).Max;
  (pIVar7->HostBackupWorkRect).Min = (pIVar8->WorkRect).Min;
  (pIVar7->HostBackupWorkRect).Max = IVar38;
  IVar38 = (pIVar8->ParentWorkRect).Max;
  (pIVar7->HostBackupParentWorkRect).Min = (pIVar8->ParentWorkRect).Min;
  (pIVar7->HostBackupParentWorkRect).Max = IVar38;
  (pIVar7->HostBackupColumnsOffset).x = (pIVar6->DC).ColumnsOffset.x;
  pIVar7->HostBackupPrevLineSize = (pIVar8->DC).PrevLineSize;
  pIVar7->HostBackupCurrLineSize = (pIVar8->DC).CurrLineSize;
  pIVar7->HostBackupCursorMaxPos = (pIVar8->DC).CursorMaxPos;
  pIVar7->HostBackupItemWidth = (pIVar6->DC).ItemWidth;
  pIVar7->HostBackupItemWidthStackSize = (pIVar6->DC).ItemWidthStack.Size;
  fVar42 = 0.0;
  fVar44 = 0.0;
  if ((uVar21 >> 9 & 1) != 0) {
    fVar44 = 1.0;
  }
  (pIVar8->DC).CurrLineSize.x = 0.0;
  (pIVar8->DC).CurrLineSize.y = 0.0;
  (pIVar8->DC).PrevLineSize.x = 0.0;
  (pIVar8->DC).PrevLineSize.y = 0.0;
  if ((uVar21 & 0x800200) == 0x200) {
    fVar42 = (pIVar11->Style).CellPadding.x;
LAB_00211b60:
    fVar43 = 0.0;
  }
  else {
    if ((uVar21 & 0x800200) != 0) goto LAB_00211b60;
    fVar43 = (pIVar11->Style).CellPadding.x;
  }
  p_00->CellSpacingX1 = fVar44 + fVar43;
  p_00->CellSpacingX2 = fVar43;
  p_00->CellPaddingX = fVar42;
  p_00->CellPaddingY = (pIVar11->Style).CellPadding.y;
  fVar44 = 0.0;
  fVar43 = 0.0;
  if ((uVar21 >> 10 & 1) != 0) {
    fVar43 = 1.0;
  }
  if ((uVar21 >> 0x16 & 1) == 0 && (uVar21 & 0x200400) != 0) {
    fVar44 = (pIVar11->Style).CellPadding.x;
  }
  p_00->OuterPaddingX = (fVar43 + fVar44) - fVar42;
  p_00->CurrentRow = -1;
  p_00->CurrentColumn = -1;
  p_00->RowBgColorCounter = 0;
  *(uint *)&p_00->field_0x98 = (uint)*(ushort *)&p_00->field_0x98;
  pIVar23 = &pIVar8->ClipRect;
  if (pIVar8 == pIVar6) {
    pIVar23 = &p_00->WorkRect;
  }
  IVar38 = pIVar23->Max;
  (p_00->InnerClipRect).Min = pIVar23->Min;
  (p_00->InnerClipRect).Max = IVar38;
  IVar38 = (p_00->InnerClipRect).Min;
  auVar40._8_8_ = 0;
  auVar40._0_4_ = (p_00->InnerClipRect).Max.x;
  auVar40._4_4_ = (p_00->InnerClipRect).Max.y;
  IVar39 = (p_00->WorkRect).Min;
  fVar43 = IVar39.x;
  fVar45 = IVar39.y;
  auVar46._8_8_ = 0;
  auVar46._0_4_ = (p_00->WorkRect).Max.x;
  auVar46._4_4_ = (p_00->WorkRect).Max.y;
  auVar41 = minps(auVar40,auVar46);
  fVar42 = IVar38.x;
  fVar44 = IVar38.y;
  uVar15 = -(uint)(fVar43 <= fVar42);
  uVar16 = -(uint)(fVar45 <= fVar44);
  (p_00->InnerClipRect).Min =
       (ImVec2)(CONCAT44(~uVar16 & (uint)fVar45,~uVar15 & (uint)fVar43) |
               CONCAT44((uint)fVar44 & uVar16,(uint)fVar42 & uVar15));
  (p_00->InnerClipRect).Max = auVar41._0_8_;
  ImRect::ClipWithFull(&p_00->InnerClipRect,&p_00->HostClipRect);
  if ((uVar21 >> 0x11 & 1) == 0) {
    fVar42 = (pIVar8->ClipRect).Max.y;
  }
  else {
    fVar42 = (p_00->InnerClipRect).Max.y;
    fVar44 = (pIVar8->WorkRect).Max.y;
    if (fVar44 <= fVar42) {
      fVar42 = fVar44;
    }
  }
  (p_00->InnerClipRect).Max.y = fVar42;
  fVar42 = (p_00->WorkRect).Min.y;
  p_00->RowPosY2 = fVar42;
  p_00->RowPosY1 = fVar42;
  p_00->RowTextBaseline = 0.0;
  p_00->FreezeRowsRequest = '\0';
  p_00->FreezeRowsCount = '\0';
  p_00->FreezeColumnsRequest = '\0';
  p_00->FreezeColumnsCount = '\0';
  p_00->IsUnfrozenRows = true;
  p_00->DeclColumnsCount = '\0';
  IVar17 = GetColorU32(0x2d,1.0);
  p_00->BorderColorStrong = IVar17;
  IVar17 = GetColorU32(0x2e,1.0);
  p_00->BorderColorLight = IVar17;
  pIVar11->CurrentTable = p_00;
  (pIVar6->DC).CurrentTableIdx = uVar14;
  if (pIVar8 != pIVar6) {
    (pIVar8->DC).CurrentTableIdx = uVar14;
  }
  if (((uVar5 & 2) != 0) && ((uVar21 & 2) == 0)) {
    p_00->IsResetDisplayOrderRequest = true;
  }
  iVar35 = (pIVar11->TablesLastTimeActive).Size;
  if (iVar35 <= (int)uVar14) {
    iVar31 = uVar14 + 1;
    iVar29 = (pIVar11->TablesLastTimeActive).Capacity;
    if (iVar29 <= (int)uVar14) {
      if (iVar29 == 0) {
        iVar29 = 8;
      }
      else {
        iVar29 = iVar29 / 2 + iVar29;
      }
      if (iVar29 <= iVar31) {
        iVar29 = iVar31;
      }
      __dest = (float *)MemAlloc((long)iVar29 << 2);
      __src = (pIVar11->TablesLastTimeActive).Data;
      if (__src != (float *)0x0) {
        memcpy(__dest,__src,(long)(pIVar11->TablesLastTimeActive).Size << 2);
        MemFree((pIVar11->TablesLastTimeActive).Data);
      }
      (pIVar11->TablesLastTimeActive).Data = __dest;
      (pIVar11->TablesLastTimeActive).Capacity = iVar29;
      iVar35 = (pIVar11->TablesLastTimeActive).Size;
    }
    if (iVar35 <= (int)uVar14) {
      lVar26 = (long)iVar35;
      do {
        (pIVar11->TablesLastTimeActive).Data[lVar26] = -1.0;
        lVar26 = lVar26 + 1;
      } while (iVar31 != lVar26);
    }
    (pIVar11->TablesLastTimeActive).Size = iVar31;
    iVar35 = iVar31;
  }
  if (((int)uVar14 < 0) || (iVar35 <= (int)uVar14)) {
    pcVar24 = "T &ImVector<float>::operator[](int) [T = float]";
LAB_00212235:
    __assert_fail("i >= 0 && i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                  ,0x706,pcVar24);
  }
  dVar3 = pIVar11->Time;
  (pIVar11->TablesLastTimeActive).Data[uVar14] = (float)dVar3;
  pIVar7->LastTimeActive = (float)dVar3;
  p_00->MemoryCompacted = false;
  pvVar9 = p_00->RawData;
  pIVar20 = (p_00->Columns).Data;
  iVar35 = (int)((long)(p_00->Columns).DataEnd - (long)pIVar20 >> 3) * -0x3b13b13b;
  if (iVar35 == columns_count || iVar35 == 0) {
    pIVar20 = (ImGuiTableColumn *)0x0;
    ptr = (void *)0x0;
    pvVar12 = (void *)0x0;
    if (pvVar9 == (void *)0x0) goto LAB_00211e8e;
  }
  else {
    p_00->RawData = (void *)0x0;
    pvVar12 = pvVar9;
LAB_00211e8e:
    ptr = pvVar12;
    TableBeginInitMemory(p_00,columns_count);
    p_00->IsSettingsRequestLoad = true;
    p_00->IsInitializing = true;
  }
  if (p_00->IsResetAllRequest == true) {
    p_00->IsInitializing = true;
    p_00->IsResetAllRequest = false;
    p_00->IsSettingsRequestLoad = false;
    p_00->IsSettingsDirty = true;
    p_00->SettingsLoadedFlags = 0;
  }
  else if ((p_00->IsInitializing & 1U) == 0) goto LAB_00212064;
  p_00->SettingsOffset = -1;
  p_00->IsSortSpecsDirty = true;
  p_00->InstanceInteracted = -1;
  p_00->ContextPopupColumn = -1;
  p_00->ReorderColumn = -1;
  p_00->HoveredColumnBody = -1;
  p_00->HoveredColumnBorder = -1;
  p_00->AutoFitSingleColumn = -1;
  p_00->ResizedColumn = -1;
  p_00->LastResizedColumn = -1;
  if (0 < columns_count) {
    lVar26 = 0x61;
    uVar30 = 0;
    do {
      pIVar10 = (p_00->Columns).Data;
      pIVar27 = (ImGuiTableColumn *)((long)pIVar10 + lVar26 + -0x61);
      if ((p_00->Columns).DataEnd <= pIVar27) goto LAB_00212176;
      if ((pIVar20 == (ImGuiTableColumn *)0x0) || ((long)iVar35 <= (long)uVar30)) {
        uVar2 = *(undefined4 *)((long)pIVar10 + lVar26 + -0x4d);
        local_78 = 0;
        local_98._Channels.Data = (ImDrawChannel *)0x0;
        uStack_80 = 0;
        uStack_7d = 0;
        local_98._Current = 0;
        local_98._Count = 0;
        local_98._Channels.Size = 0;
        local_98._Channels.Capacity = 0;
        local_a8.x = 0.0;
        local_a8.y = 0.0;
        uStack_a0 = 0;
        uStack_70 = 0xffffff;
        uStack_74 = 0xffffffff;
        pIVar27->Flags = 0;
        pIVar27->WidthGiven = 0.0;
        *(undefined8 *)((long)pIVar10 + lVar26 + -0x59) = 0;
        *(undefined4 *)((long)pIVar10 + lVar26 + -0x51) = 0xbf800000;
        *(undefined4 *)((long)pIVar10 + lVar26 + -0x49) = 0xbf800000;
        puVar1 = (undefined8 *)((long)pIVar10 + lVar26 + -0x45);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar10 + lVar26 + -0x35);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar10 + lVar26 + -0x25);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pIVar10 + lVar26 + -0x1a);
        *puVar1 = 0;
        puVar1[1] = 0xffffffffffffff00;
        *(undefined4 *)((long)&pIVar10->Flags + lVar26 + 2) = 0;
        *(undefined8 *)((long)pIVar10 + lVar26 + -5) = 0;
        *(undefined4 *)((long)pIVar10 + lVar26 + -0x4d) = uVar2;
        *(undefined1 *)((long)&pIVar10->Flags + lVar26) = 1;
        *(undefined2 *)((long)pIVar10 + lVar26 + -6) = 0x101;
        *(undefined4 *)((long)pIVar10 + lVar26 + -10) = 0x1ffffff;
      }
      else {
        pIVar33 = (ImGuiTableColumnFlags *)((long)pIVar20 + lVar26 + -0x61);
        for (lVar36 = 0x19; lVar36 != 0; lVar36 = lVar36 + -1) {
          pIVar27->Flags = *pIVar33;
          pIVar33 = pIVar33 + (ulong)bVar37 * -2 + 1;
          pIVar27 = (ImGuiTableColumn *)((long)pIVar27 + (ulong)bVar37 * -8 + 4);
        }
        *(undefined1 *)((long)&pIVar10->WidthGiven + lVar26 + 1) =
             *(undefined1 *)((long)&pIVar20->WidthGiven + lVar26 + 1);
        *(undefined2 *)((long)&pIVar10->Flags + lVar26 + 3) =
             *(undefined2 *)((long)&pIVar20->Flags + lVar26 + 3);
      }
      pcVar24 = (p_00->DisplayOrderToIndex).Data + uVar30;
      if ((p_00->DisplayOrderToIndex).DataEnd <= pcVar24) {
        pcVar24 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
        goto LAB_002121a2;
      }
      *pcVar24 = (char)uVar30;
      *(char *)((long)pIVar10 + lVar26 + -0xf) = (char)uVar30;
      uVar30 = uVar30 + 1;
      lVar26 = lVar26 + 0x68;
    } while ((uint)columns_count != uVar30);
  }
LAB_00212064:
  if (ptr != (void *)0x0) {
    MemFree(ptr);
  }
  if (p_00->IsSettingsRequestLoad == true) {
    TableLoadSettings(p_00);
  }
  fVar42 = pIVar11->FontSize;
  fVar44 = p_00->RefScale;
  if ((fVar44 != 0.0) || (NAN(fVar44))) {
    if (((fVar44 != fVar42) || (NAN(fVar44) || NAN(fVar42))) && (0 < columns_count)) {
      pIVar20 = (p_00->Columns).Data;
      do {
        if ((p_00->Columns).DataEnd <= pIVar20) {
LAB_00212176:
          pcVar24 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_002121a2:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                        ,0x24a,pcVar24);
        }
        pIVar20->WidthRequest = pIVar20->WidthRequest * (fVar42 / fVar44);
        pIVar20 = pIVar20 + 1;
        uVar25 = uVar25 - 1;
      } while (uVar25 != 0);
    }
  }
  p_00->RefScale = fVar42;
  pIVar8->SkipItems = true;
  if (0 < (p_00->ColumnsNames).Buf.Size) {
    if ((p_00->ColumnsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      pcVar24 = (p_00->ColumnsNames).Buf.Data;
      if (pcVar24 != (char *)0x0) {
        memcpy(__dest_00,pcVar24,(long)(p_00->ColumnsNames).Buf.Size);
        MemFree((p_00->ColumnsNames).Buf.Data);
      }
      (p_00->ColumnsNames).Buf.Data = __dest_00;
      (p_00->ColumnsNames).Buf.Capacity = 0;
    }
    (p_00->ColumnsNames).Buf.Size = 0;
  }
  TableBeginApplyRequests(p_00);
  return true;
}

Assistant:

bool    ImGui::BeginTableEx(const char* name, ImGuiID id, int columns_count, ImGuiTableFlags flags, const ImVec2& outer_size, float inner_width)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* outer_window = GetCurrentWindow();
    if (outer_window->SkipItems) // Consistent with other tables + beneficial side effect that assert on miscalling EndTable() will be more visible.
        return false;

    // Sanity checks
    IM_ASSERT(columns_count > 0 && columns_count <= IMGUI_TABLE_MAX_COLUMNS && "Only 1..64 columns allowed!");
    if (flags & ImGuiTableFlags_ScrollX)
        IM_ASSERT(inner_width >= 0.0f);

    // If an outer size is specified ahead we will be able to early out when not visible. Exact clipping rules may evolve.
    const bool use_child_window = (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) != 0;
    const ImVec2 avail_size = GetContentRegionAvail();
    ImVec2 actual_outer_size = CalcItemSize(outer_size, ImMax(avail_size.x, 1.0f), use_child_window ? ImMax(avail_size.y, 1.0f) : 0.0f);
    ImRect outer_rect(outer_window->DC.CursorPos, outer_window->DC.CursorPos + actual_outer_size);
    if (use_child_window && IsClippedEx(outer_rect, 0))
    {
        ItemSize(outer_rect);
        return false;
    }

    // Acquire storage for the table
    ImGuiTable* table = g.Tables.GetOrAddByKey(id);
    const int instance_no = (table->LastFrameActive != g.FrameCount) ? 0 : table->InstanceCurrent + 1;
    const ImGuiID instance_id = id + instance_no;
    const ImGuiTableFlags table_last_flags = table->Flags;
    if (instance_no > 0)
        IM_ASSERT(table->ColumnsCount == columns_count && "BeginTable(): Cannot change columns count mid-frame while preserving same ID");

    // Acquire temporary buffers
    const int table_idx = g.Tables.GetIndex(table);
    g.CurrentTableStackIdx++;
    if (g.CurrentTableStackIdx + 1 > g.TablesTempDataStack.Size)
        g.TablesTempDataStack.resize(g.CurrentTableStackIdx + 1, ImGuiTableTempData());
    ImGuiTableTempData* temp_data = table->TempData = &g.TablesTempDataStack[g.CurrentTableStackIdx];
    temp_data->TableIndex = table_idx;
    table->DrawSplitter = &table->TempData->DrawSplitter;
    table->DrawSplitter->Clear();

    // Fix flags
    table->IsDefaultSizingPolicy = (flags & ImGuiTableFlags_SizingMask_) == 0;
    flags = TableFixFlags(flags, outer_window);

    // Initialize
    table->ID = id;
    table->Flags = flags;
    table->InstanceCurrent = (ImS16)instance_no;
    table->LastFrameActive = g.FrameCount;
    table->OuterWindow = table->InnerWindow = outer_window;
    table->ColumnsCount = columns_count;
    table->IsLayoutLocked = false;
    table->InnerWidth = inner_width;
    temp_data->UserOuterSize = outer_size;

    // When not using a child window, WorkRect.Max will grow as we append contents.
    if (use_child_window)
    {
        // Ensure no vertical scrollbar appears if we only want horizontal one, to make flag consistent
        // (we have no other way to disable vertical scrollbar of a window while keeping the horizontal one showing)
        ImVec2 override_content_size(FLT_MAX, FLT_MAX);
        if ((flags & ImGuiTableFlags_ScrollX) && !(flags & ImGuiTableFlags_ScrollY))
            override_content_size.y = FLT_MIN;

        // Ensure specified width (when not specified, Stretched columns will act as if the width == OuterWidth and
        // never lead to any scrolling). We don't handle inner_width < 0.0f, we could potentially use it to right-align
        // based on the right side of the child window work rect, which would require knowing ahead if we are going to
        // have decoration taking horizontal spaces (typically a vertical scrollbar).
        if ((flags & ImGuiTableFlags_ScrollX) && inner_width > 0.0f)
            override_content_size.x = inner_width;

        if (override_content_size.x != FLT_MAX || override_content_size.y != FLT_MAX)
            SetNextWindowContentSize(ImVec2(override_content_size.x != FLT_MAX ? override_content_size.x : 0.0f, override_content_size.y != FLT_MAX ? override_content_size.y : 0.0f));

        // Reset scroll if we are reactivating it
        if ((table_last_flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY)) == 0)
            SetNextWindowScroll(ImVec2(0.0f, 0.0f));

        // Create scrolling region (without border and zero window padding)
        ImGuiWindowFlags child_flags = (flags & ImGuiTableFlags_ScrollX) ? ImGuiWindowFlags_HorizontalScrollbar : ImGuiWindowFlags_None;
        BeginChildEx(name, instance_id, outer_rect.GetSize(), false, child_flags);
        table->InnerWindow = g.CurrentWindow;
        table->WorkRect = table->InnerWindow->WorkRect;
        table->OuterRect = table->InnerWindow->Rect();
        table->InnerRect = table->InnerWindow->InnerRect;
        IM_ASSERT(table->InnerWindow->WindowPadding.x == 0.0f && table->InnerWindow->WindowPadding.y == 0.0f && table->InnerWindow->WindowBorderSize == 0.0f);
    }
    else
    {
        // For non-scrolling tables, WorkRect == OuterRect == InnerRect.
        // But at this point we do NOT have a correct value for .Max.y (unless a height has been explicitly passed in). It will only be updated in EndTable().
        table->WorkRect = table->OuterRect = table->InnerRect = outer_rect;
    }

    // Push a standardized ID for both child-using and not-child-using tables
    PushOverrideID(instance_id);

    // Backup a copy of host window members we will modify
    ImGuiWindow* inner_window = table->InnerWindow;
    table->HostIndentX = inner_window->DC.Indent.x;
    table->HostClipRect = inner_window->ClipRect;
    table->HostSkipItems = inner_window->SkipItems;
    temp_data->HostBackupWorkRect = inner_window->WorkRect;
    temp_data->HostBackupParentWorkRect = inner_window->ParentWorkRect;
    temp_data->HostBackupColumnsOffset = outer_window->DC.ColumnsOffset;
    temp_data->HostBackupPrevLineSize = inner_window->DC.PrevLineSize;
    temp_data->HostBackupCurrLineSize = inner_window->DC.CurrLineSize;
    temp_data->HostBackupCursorMaxPos = inner_window->DC.CursorMaxPos;
    temp_data->HostBackupItemWidth = outer_window->DC.ItemWidth;
    temp_data->HostBackupItemWidthStackSize = outer_window->DC.ItemWidthStack.Size;
    inner_window->DC.PrevLineSize = inner_window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);

    // Padding and Spacing
    // - None               ........Content..... Pad .....Content........
    // - PadOuter           | Pad ..Content..... Pad .....Content.. Pad |
    // - PadInner           ........Content.. Pad | Pad ..Content........
    // - PadOuter+PadInner  | Pad ..Content.. Pad | Pad ..Content.. Pad |
    const bool pad_outer_x = (flags & ImGuiTableFlags_NoPadOuterX) ? false : (flags & ImGuiTableFlags_PadOuterX) ? true : (flags & ImGuiTableFlags_BordersOuterV) != 0;
    const bool pad_inner_x = (flags & ImGuiTableFlags_NoPadInnerX) ? false : true;
    const float inner_spacing_for_border = (flags & ImGuiTableFlags_BordersInnerV) ? TABLE_BORDER_SIZE : 0.0f;
    const float inner_spacing_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) == 0) ? g.Style.CellPadding.x : 0.0f;
    const float inner_padding_explicit = (pad_inner_x && (flags & ImGuiTableFlags_BordersInnerV) != 0) ? g.Style.CellPadding.x : 0.0f;
    table->CellSpacingX1 = inner_spacing_explicit + inner_spacing_for_border;
    table->CellSpacingX2 = inner_spacing_explicit;
    table->CellPaddingX = inner_padding_explicit;
    table->CellPaddingY = g.Style.CellPadding.y;

    const float outer_padding_for_border = (flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
    const float outer_padding_explicit = pad_outer_x ? g.Style.CellPadding.x : 0.0f;
    table->OuterPaddingX = (outer_padding_for_border + outer_padding_explicit) - table->CellPaddingX;

    table->CurrentColumn = -1;
    table->CurrentRow = -1;
    table->RowBgColorCounter = 0;
    table->LastRowFlags = ImGuiTableRowFlags_None;
    table->InnerClipRect = (inner_window == outer_window) ? table->WorkRect : inner_window->ClipRect;
    table->InnerClipRect.ClipWith(table->WorkRect);     // We need this to honor inner_width
    table->InnerClipRect.ClipWithFull(table->HostClipRect);
    table->InnerClipRect.Max.y = (flags & ImGuiTableFlags_NoHostExtendY) ? ImMin(table->InnerClipRect.Max.y, inner_window->WorkRect.Max.y) : inner_window->ClipRect.Max.y;

    table->RowPosY1 = table->RowPosY2 = table->WorkRect.Min.y; // This is needed somehow
    table->RowTextBaseline = 0.0f; // This will be cleared again by TableBeginRow()
    table->FreezeRowsRequest = table->FreezeRowsCount = 0; // This will be setup by TableSetupScrollFreeze(), if any
    table->FreezeColumnsRequest = table->FreezeColumnsCount = 0;
    table->IsUnfrozenRows = true;
    table->DeclColumnsCount = 0;

    // Using opaque colors facilitate overlapping elements of the grid
    table->BorderColorStrong = GetColorU32(ImGuiCol_TableBorderStrong);
    table->BorderColorLight = GetColorU32(ImGuiCol_TableBorderLight);

    // Make table current
    g.CurrentTable = table;
    outer_window->DC.CurrentTableIdx = table_idx;
    if (inner_window != outer_window) // So EndChild() within the inner window can restore the table properly.
        inner_window->DC.CurrentTableIdx = table_idx;

    if ((table_last_flags & ImGuiTableFlags_Reorderable) && (flags & ImGuiTableFlags_Reorderable) == 0)
        table->IsResetDisplayOrderRequest = true;

    // Mark as used
    if (table_idx >= g.TablesLastTimeActive.Size)
        g.TablesLastTimeActive.resize(table_idx + 1, -1.0f);
    g.TablesLastTimeActive[table_idx] = (float)g.Time;
    temp_data->LastTimeActive = (float)g.Time;
    table->MemoryCompacted = false;

    // Setup memory buffer (clear data if columns count changed)
    ImGuiTableColumn* old_columns_to_preserve = NULL;
    void* old_columns_raw_data = NULL;
    const int old_columns_count = table->Columns.size();
    if (old_columns_count != 0 && old_columns_count != columns_count)
    {
        // Attempt to preserve width on column count change (#4046)
        old_columns_to_preserve = table->Columns.Data;
        old_columns_raw_data = table->RawData;
        table->RawData = NULL;
    }
    if (table->RawData == NULL)
    {
        TableBeginInitMemory(table, columns_count);
        table->IsInitializing = table->IsSettingsRequestLoad = true;
    }
    if (table->IsResetAllRequest)
        TableResetSettings(table);
    if (table->IsInitializing)
    {
        // Initialize
        table->SettingsOffset = -1;
        table->IsSortSpecsDirty = true;
        table->InstanceInteracted = -1;
        table->ContextPopupColumn = -1;
        table->ReorderColumn = table->ResizedColumn = table->LastResizedColumn = -1;
        table->AutoFitSingleColumn = -1;
        table->HoveredColumnBody = table->HoveredColumnBorder = -1;
        for (int n = 0; n < columns_count; n++)
        {
            ImGuiTableColumn* column = &table->Columns[n];
            if (old_columns_to_preserve && n < old_columns_count)
            {
                // FIXME: We don't attempt to preserve column order in this path.
                *column = old_columns_to_preserve[n];
            }
            else
            {
                float width_auto = column->WidthAuto;
                *column = ImGuiTableColumn();
                column->WidthAuto = width_auto;
                column->IsPreserveWidthAuto = true; // Preserve WidthAuto when reinitializing a live table: not technically necessary but remove a visible flicker
                column->IsEnabled = column->IsUserEnabled = column->IsUserEnabledNextFrame = true;
            }
            column->DisplayOrder = table->DisplayOrderToIndex[n] = (ImGuiTableColumnIdx)n;
        }
    }
    if (old_columns_raw_data)
        IM_FREE(old_columns_raw_data);

    // Load settings
    if (table->IsSettingsRequestLoad)
        TableLoadSettings(table);

    // Handle DPI/font resize
    // This is designed to facilitate DPI changes with the assumption that e.g. style.CellPadding has been scaled as well.
    // It will also react to changing fonts with mixed results. It doesn't need to be perfect but merely provide a decent transition.
    // FIXME-DPI: Provide consistent standards for reference size. Perhaps using g.CurrentDpiScale would be more self explanatory.
    // This is will lead us to non-rounded WidthRequest in columns, which should work but is a poorly tested path.
    const float new_ref_scale_unit = g.FontSize; // g.Font->GetCharAdvance('A') ?
    if (table->RefScale != 0.0f && table->RefScale != new_ref_scale_unit)
    {
        const float scale_factor = new_ref_scale_unit / table->RefScale;
        //IMGUI_DEBUG_LOG("[table] %08X RefScaleUnit %.3f -> %.3f, scaling width by %.3f\n", table->ID, table->RefScaleUnit, new_ref_scale_unit, scale_factor);
        for (int n = 0; n < columns_count; n++)
            table->Columns[n].WidthRequest = table->Columns[n].WidthRequest * scale_factor;
    }
    table->RefScale = new_ref_scale_unit;

    // Disable output until user calls TableNextRow() or TableNextColumn() leading to the TableUpdateLayout() call..
    // This is not strictly necessary but will reduce cases were "out of table" output will be misleading to the user.
    // Because we cannot safely assert in EndTable() when no rows have been created, this seems like our best option.
    inner_window->SkipItems = true;

    // Clear names
    // At this point the ->NameOffset field of each column will be invalid until TableUpdateLayout() or the first call to TableSetupColumn()
    if (table->ColumnsNames.Buf.Size > 0)
        table->ColumnsNames.Buf.resize(0);

    // Apply queued resizing/reordering/hiding requests
    TableBeginApplyRequests(table);

    return true;
}